

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrSig_GetNonce_Test::TestBody(SchnorrSig_GetNonce_Test *this)

{
  char *message;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_88;
  AssertionResult gtest_ar;
  string local_60;
  SchnorrPubkey sig_nonce;
  string expected_nonce;
  
  std::__cxx11::string::string
            ((string *)&expected_nonce,
             "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee",
             (allocator *)&local_60);
  cfd::core::SchnorrSignature::GetNonce(&sig_nonce,&::signature);
  cfd::core::SchnorrPubkey::GetData((ByteData *)&_Stack_88,&sig_nonce);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_60,(ByteData *)&_Stack_88);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expected_nonce","sig_nonce.GetData().GetHex()",&expected_nonce,
             &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&_Stack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x4a,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&_Stack_88,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&_Stack_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_nonce);
  std::__cxx11::string::~string((string *)&expected_nonce);
  return;
}

Assistant:

TEST(SchnorrSig, GetNonce) {
  std::string expected_nonce =
      "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee";

  auto sig_nonce = signature.GetNonce();

  EXPECT_EQ(expected_nonce, sig_nonce.GetData().GetHex());
}